

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O1

void __thiscall ImportBool_True_Test::~ImportBool_True_Test(ImportBool_True_Test *this)

{
  (this->super_ImportBool).super_RuleTest.super_Test._vptr_Test =
       (_func_int **)&PTR__RuleTest_00241e80;
  pstore::database::~database(&(this->super_ImportBool).super_RuleTest.db_);
  in_memory_store::~in_memory_store(&(this->super_ImportBool).super_RuleTest.db_storage_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (ImportBool, True) {
    bool v = false;
    auto parser = make_json_bool_parser (&v);
    parser.input ("true");
    parser.eof ();

    // Check the result.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_EQ (v, true);
}